

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockFailureTest.cpp
# Opt level: O1

void __thiscall
TEST_MockFailureTest_MockExpectedParameterDidntHappenFailure_Test::testBody
          (TEST_MockFailureTest_MockExpectedParameterDidntHappenFailure_Test *this)

{
  MockCheckedExpectedCall *pMVar1;
  int iVar2;
  undefined4 extraout_var;
  long *plVar3;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  UtestShell *pUVar4;
  char *pcVar5;
  TestTerminator *pTVar6;
  MockExpectedCallsList matchingCalls;
  MockExpectedParameterDidntHappenFailure failure;
  MockExpectedCallsList local_b0;
  undefined1 local_a0 [120];
  SimpleString local_28;
  
  pMVar1 = (this->super_TEST_GROUP_CppUTestGroupMockFailureTest).call1;
  SimpleString::SimpleString((SimpleString *)(local_a0 + 0x10),"foo");
  iVar2 = (*(pMVar1->super_MockExpectedCall)._vptr_MockExpectedCall[2])
                    (pMVar1,(SimpleString *)(local_a0 + 0x10));
  SimpleString::SimpleString((SimpleString *)&local_b0,"bar");
  plVar3 = (long *)(**(code **)(*(long *)CONCAT44(extraout_var,iVar2) + 0x58))
                             ((long *)CONCAT44(extraout_var,iVar2),&local_b0,2);
  SimpleString::SimpleString((SimpleString *)local_a0,"boo");
  (**(code **)(*plVar3 + 0x98))(plVar3,local_a0,"str");
  SimpleString::~SimpleString((SimpleString *)local_a0);
  SimpleString::~SimpleString((SimpleString *)&local_b0);
  SimpleString::~SimpleString((SimpleString *)(local_a0 + 0x10));
  pMVar1 = (this->super_TEST_GROUP_CppUTestGroupMockFailureTest).call1;
  SimpleString::SimpleString((SimpleString *)(local_a0 + 0x10),"bar");
  (*(pMVar1->super_MockExpectedCall)._vptr_MockExpectedCall[0x37])
            (pMVar1,(SimpleString *)(local_a0 + 0x10));
  SimpleString::~SimpleString((SimpleString *)(local_a0 + 0x10));
  pMVar1 = (this->super_TEST_GROUP_CppUTestGroupMockFailureTest).call2;
  SimpleString::SimpleString((SimpleString *)(local_a0 + 0x10),"foo");
  iVar2 = (*(pMVar1->super_MockExpectedCall)._vptr_MockExpectedCall[2])
                    (pMVar1,(SimpleString *)(local_a0 + 0x10));
  SimpleString::SimpleString((SimpleString *)&local_b0,"bar");
  plVar3 = (long *)(**(code **)(*(long *)CONCAT44(extraout_var_00,iVar2) + 0x58))
                             ((long *)CONCAT44(extraout_var_00,iVar2),&local_b0,10);
  SimpleString::SimpleString((SimpleString *)local_a0,"boo");
  (**(code **)(*plVar3 + 0x98))(plVar3,local_a0,"bleh");
  SimpleString::~SimpleString((SimpleString *)local_a0);
  SimpleString::~SimpleString((SimpleString *)&local_b0);
  SimpleString::~SimpleString((SimpleString *)(local_a0 + 0x10));
  pMVar1 = (this->super_TEST_GROUP_CppUTestGroupMockFailureTest).call2;
  (*(pMVar1->super_MockExpectedCall)._vptr_MockExpectedCall[0x36])(pMVar1,1);
  pMVar1 = (this->super_TEST_GROUP_CppUTestGroupMockFailureTest).call2;
  SimpleString::SimpleString((SimpleString *)(local_a0 + 0x10),"bar");
  (*(pMVar1->super_MockExpectedCall)._vptr_MockExpectedCall[0x37])
            (pMVar1,(SimpleString *)(local_a0 + 0x10));
  SimpleString::~SimpleString((SimpleString *)(local_a0 + 0x10));
  pMVar1 = (this->super_TEST_GROUP_CppUTestGroupMockFailureTest).call2;
  SimpleString::SimpleString((SimpleString *)(local_a0 + 0x10),"boo");
  (*(pMVar1->super_MockExpectedCall)._vptr_MockExpectedCall[0x37])
            (pMVar1,(SimpleString *)(local_a0 + 0x10));
  SimpleString::~SimpleString((SimpleString *)(local_a0 + 0x10));
  pMVar1 = (this->super_TEST_GROUP_CppUTestGroupMockFailureTest).call3;
  SimpleString::SimpleString((SimpleString *)(local_a0 + 0x10),"foo");
  iVar2 = (*(pMVar1->super_MockExpectedCall)._vptr_MockExpectedCall[2])
                    (pMVar1,(SimpleString *)(local_a0 + 0x10));
  SimpleString::SimpleString((SimpleString *)&local_b0,"bar");
  plVar3 = (long *)(**(code **)(*(long *)CONCAT44(extraout_var_01,iVar2) + 0x58))
                             ((long *)CONCAT44(extraout_var_01,iVar2),&local_b0,2);
  SimpleString::SimpleString((SimpleString *)local_a0,"boo");
  plVar3 = (long *)(**(code **)(*plVar3 + 0x98))(plVar3,local_a0,"blah");
  SimpleString::SimpleString(&local_28,"baa");
  (**(code **)(*plVar3 + 0x60))(plVar3,&local_28,0);
  SimpleString::~SimpleString(&local_28);
  SimpleString::~SimpleString((SimpleString *)local_a0);
  SimpleString::~SimpleString((SimpleString *)&local_b0);
  SimpleString::~SimpleString((SimpleString *)(local_a0 + 0x10));
  pMVar1 = (this->super_TEST_GROUP_CppUTestGroupMockFailureTest).call3;
  SimpleString::SimpleString((SimpleString *)(local_a0 + 0x10),"bar");
  (*(pMVar1->super_MockExpectedCall)._vptr_MockExpectedCall[0x37])
            (pMVar1,(SimpleString *)(local_a0 + 0x10));
  SimpleString::~SimpleString((SimpleString *)(local_a0 + 0x10));
  pMVar1 = (this->super_TEST_GROUP_CppUTestGroupMockFailureTest).call4;
  SimpleString::SimpleString((SimpleString *)(local_a0 + 0x10),"foo");
  iVar2 = (*(pMVar1->super_MockExpectedCall)._vptr_MockExpectedCall[2])
                    (pMVar1,(SimpleString *)(local_a0 + 0x10));
  SimpleString::SimpleString((SimpleString *)&local_b0,"bar");
  (**(code **)(*(long *)CONCAT44(extraout_var_02,iVar2) + 0x58))
            ((long *)CONCAT44(extraout_var_02,iVar2),&local_b0,0x14);
  SimpleString::~SimpleString((SimpleString *)&local_b0);
  SimpleString::~SimpleString((SimpleString *)(local_a0 + 0x10));
  pMVar1 = (this->super_TEST_GROUP_CppUTestGroupMockFailureTest).call5;
  SimpleString::SimpleString((SimpleString *)(local_a0 + 0x10),"unrelated");
  (*(pMVar1->super_MockExpectedCall)._vptr_MockExpectedCall[2])
            (pMVar1,(SimpleString *)(local_a0 + 0x10));
  SimpleString::~SimpleString((SimpleString *)(local_a0 + 0x10));
  TEST_GROUP_CppUTestGroupMockFailureTest::addFiveCallsToList
            (&this->super_TEST_GROUP_CppUTestGroupMockFailureTest);
  MockExpectedCallsList::MockExpectedCallsList(&local_b0);
  MockExpectedCallsList::addExpectedCall
            (&local_b0,(this->super_TEST_GROUP_CppUTestGroupMockFailureTest).call1);
  MockExpectedCallsList::addExpectedCall
            (&local_b0,(this->super_TEST_GROUP_CppUTestGroupMockFailureTest).call3);
  pUVar4 = UtestShell::getCurrent();
  SimpleString::SimpleString((SimpleString *)local_a0,"foo");
  MockExpectedParameterDidntHappenFailure::MockExpectedParameterDidntHappenFailure
            ((MockExpectedParameterDidntHappenFailure *)(local_a0 + 0x10),pUVar4,
             (SimpleString *)local_a0,(this->super_TEST_GROUP_CppUTestGroupMockFailureTest).list,
             &local_b0);
  SimpleString::~SimpleString((SimpleString *)local_a0);
  pUVar4 = UtestShell::getCurrent();
  TestFailure::getMessage((TestFailure *)local_a0);
  pcVar5 = SimpleString::asCharString((SimpleString *)local_a0);
  pTVar6 = UtestShell::getCurrentTestTerminator();
  (*pUVar4->_vptr_UtestShell[9])
            (pUVar4,
             "Mock Failure: Expected parameter for function \"foo\" did not happen.\n\tEXPECTED calls with MISSING parameters related to function: foo\n\t\tfoo -> int bar: <2 (0x2)>, const char* boo: <str> (expected 1 call, called 0 times)\n\t\t\tMISSING parameters: const char* boo\n\t\tfoo -> int bar: <2 (0x2)>, const char* boo: <blah>, unsigned int baa: <0 (0x0)> (expected 1 call, called 0 times)\n\t\t\tMISSING parameters: const char* boo, unsigned int baa\n\tEXPECTED calls that WERE NOT fulfilled related to function: foo\n\t\tfoo -> int bar: <2 (0x2)>, const char* boo: <str> (expected 1 call, called 0 times)\n\t\tfoo -> int bar: <2 (0x2)>, const char* boo: <blah>, unsigned int baa: <0 (0x0)> (expected 1 call, called 0 times)\n\t\tfoo -> int bar: <20 (0x14)> (expected 1 call, called 0 times)\n\tEXPECTED calls that WERE fulfilled related to function: foo\n\t\tfoo -> int bar: <10 (0xa)>, const char* boo: <bleh> (expected 1 call, called 1 time)"
             ,pcVar5,0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockFailureTest.cpp"
             ,0x113,pTVar6);
  SimpleString::~SimpleString((SimpleString *)local_a0);
  TestFailure::~TestFailure((TestFailure *)(local_a0 + 0x10));
  MockExpectedCallsList::~MockExpectedCallsList(&local_b0);
  return;
}

Assistant:

TEST(MockFailureTest, MockExpectedParameterDidntHappenFailure)
{
    call1->withName("foo").withParameter("bar", 2).withParameter("boo", "str");
    call1->inputParameterWasPassed("bar");
    call2->withName("foo").withParameter("bar", 10).withParameter("boo", "bleh");
    call2->callWasMade(1);
    call2->inputParameterWasPassed("bar");
    call2->inputParameterWasPassed("boo");
    call3->withName("foo").withParameter("bar", 2).withParameter("boo", "blah").withParameter("baa", 0u);
    call3->inputParameterWasPassed("bar");
    call4->withName("foo").withParameter("bar", 20);
    call5->withName("unrelated");
    addFiveCallsToList();

    MockExpectedCallsList matchingCalls;
    matchingCalls.addExpectedCall(call1);
    matchingCalls.addExpectedCall(call3);

    MockExpectedParameterDidntHappenFailure failure(UtestShell::getCurrent(), "foo", *list, matchingCalls);
    STRCMP_EQUAL("Mock Failure: Expected parameter for function \"foo\" did not happen.\n"
                 "\tEXPECTED calls with MISSING parameters related to function: foo\n"
                 "\t\tfoo -> int bar: <2 (0x2)>, const char* boo: <str> (expected 1 call, called 0 times)\n"
                 "\t\t\tMISSING parameters: const char* boo\n"
                 "\t\tfoo -> int bar: <2 (0x2)>, const char* boo: <blah>, unsigned int baa: <0 (0x0)> (expected 1 call, called 0 times)\n"
                 "\t\t\tMISSING parameters: const char* boo, unsigned int baa\n"
                 "\tEXPECTED calls that WERE NOT fulfilled related to function: foo\n"
                 "\t\tfoo -> int bar: <2 (0x2)>, const char* boo: <str> (expected 1 call, called 0 times)\n"
                 "\t\tfoo -> int bar: <2 (0x2)>, const char* boo: <blah>, unsigned int baa: <0 (0x0)> (expected 1 call, called 0 times)\n"
                 "\t\tfoo -> int bar: <20 (0x14)> (expected 1 call, called 0 times)\n"
                 "\tEXPECTED calls that WERE fulfilled related to function: foo\n"
                 "\t\tfoo -> int bar: <10 (0xa)>, const char* boo: <bleh> (expected 1 call, called 1 time)",
                 failure.getMessage().asCharString());
}